

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
anon_unknown.dwarf_54df9::assignments_as_proof_decisions(Assignments *assignments)

{
  bool bVar1;
  undefined8 in_RSI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  type *r;
  type *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *trail;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__lhs;
  int *in_stack_ffffffffffffffa8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x12b6c4);
  local_20 = local_10;
  local_28._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(in_RDI);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)__lhs,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                      *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator*(&local_28);
    std::get<0ul,int,int>((pair<int,_int> *)0x12b71c);
    std::get<1ul,int,int>((pair<int,_int> *)0x12b72b);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<int_const&,int_const&>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)__lhs);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_28);
  }
  return __lhs;
}

Assistant:

auto assignments_as_proof_decisions(const Assignments & assignments) -> vector<pair<int, int>>
    {
        vector<pair<int, int>> trail;
        for (auto & [l, r] : assignments.assigned)
            trail.emplace_back(l, r);
        return trail;
    }